

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O2

void aom_lpf_vertical_6_quad_sse2
               (uint8_t *s,int pitch,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0)

{
  uchar t_dst [128];
  
  transpose_16x8(s + -4,s + (long)(pitch * 8) + -4,pitch,t_dst,0x10);
  (*aom_lpf_horizontal_6_quad)(t_dst + 0x40,0x10,_blimit0,_limit0,_thresh0);
  transpose_16x8_to_8x16(t_dst,(int)(s + -4),(uchar *)(ulong)(uint)pitch,(int)_limit0);
  return;
}

Assistant:

void aom_lpf_vertical_6_quad_sse2(uint8_t *s, int pitch,
                                  const uint8_t *_blimit0,
                                  const uint8_t *_limit0,
                                  const uint8_t *_thresh0) {
  DECLARE_ALIGNED(16, unsigned char, t_dst[16 * 8]);

  // Transpose 16x8:: (wxh) 8x16 to 16x8
  transpose_16x8(s - 4, s - 4 + pitch * 8, pitch, t_dst, 16);

  // Loop filtering
  aom_lpf_horizontal_6_quad(t_dst + 4 * 16, 16, _blimit0, _limit0, _thresh0);

  // Transpose back:: (wxh) 16x8 to 8x16
  transpose_16x8_to_8x16(t_dst, 16, s - 4, pitch);
}